

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTessellationTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::invalid_get_programiv(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLint local_18;
  GLuint local_14;
  GLint params [1];
  GLuint program;
  NegativeTestContext *ctx_local;
  
  _params = ctx;
  checkTessellationSupport(ctx);
  local_14 = glu::CallLogWrapper::glCreateProgram(&_params->super_CallLogWrapper);
  pNVar1 = _params;
  local_18 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_OPERATION is generated if GL_TESS_CONTROL_OUTPUT_VERTICES is queried for a program which has not been linked properly."
             ,&local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glGetProgramiv(&_params->super_CallLogWrapper,local_14,0x8e75,&local_18);
  NegativeTestContext::expectError(_params,0x502);
  NegativeTestContext::endSection(_params);
  pNVar1 = _params;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_OPERATION is generated if GL_TESS_GEN_MODE is queried for a program which has not been linked properly."
             ,&local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glGetProgramiv(&_params->super_CallLogWrapper,local_14,0x8e76,&local_18);
  NegativeTestContext::expectError(_params,0x502);
  NegativeTestContext::endSection(_params);
  pNVar1 = _params;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "GL_INVALID_OPERATION is generated if GL_TESS_GEN_SPACING is queried for a program which has not been linked properly."
             ,&local_99);
  NegativeTestContext::beginSection(pNVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::glGetProgramiv(&_params->super_CallLogWrapper,local_14,0x8e77,&local_18);
  NegativeTestContext::expectError(_params,0x502);
  NegativeTestContext::endSection(_params);
  pNVar1 = _params;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "GL_INVALID_OPERATION is generated if GL_TESS_GEN_VERTEX_ORDER is queried for a program which has not been linked properly."
             ,&local_c1);
  NegativeTestContext::beginSection(pNVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  glu::CallLogWrapper::glGetProgramiv(&_params->super_CallLogWrapper,local_14,0x8e78,&local_18);
  NegativeTestContext::expectError(_params,0x502);
  NegativeTestContext::endSection(_params);
  pNVar1 = _params;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,
             "GL_INVALID_OPERATION is generated if GL_TESS_GEN_POINT_MODE is queried for a program which has not been linked properly."
             ,&local_e9);
  NegativeTestContext::beginSection(pNVar1,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  glu::CallLogWrapper::glGetProgramiv(&_params->super_CallLogWrapper,local_14,0x8e79,&local_18);
  NegativeTestContext::expectError(_params,0x502);
  NegativeTestContext::endSection(_params);
  glu::CallLogWrapper::glDeleteProgram(&_params->super_CallLogWrapper,local_14);
  return;
}

Assistant:

void invalid_get_programiv (NegativeTestContext& ctx)
{
	checkTessellationSupport(ctx);

	GLuint	program		= ctx.glCreateProgram();
	GLint	params[1]	= { 0 };

	ctx.beginSection("GL_INVALID_OPERATION is generated if GL_TESS_CONTROL_OUTPUT_VERTICES is queried for a program which has not been linked properly.");
	ctx.glGetProgramiv(program, GL_TESS_CONTROL_OUTPUT_VERTICES, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if GL_TESS_GEN_MODE is queried for a program which has not been linked properly.");
	ctx.glGetProgramiv(program, GL_TESS_GEN_MODE, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if GL_TESS_GEN_SPACING is queried for a program which has not been linked properly.");
	ctx.glGetProgramiv(program, GL_TESS_GEN_SPACING, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if GL_TESS_GEN_VERTEX_ORDER is queried for a program which has not been linked properly.");
	ctx.glGetProgramiv(program, GL_TESS_GEN_VERTEX_ORDER, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if GL_TESS_GEN_POINT_MODE is queried for a program which has not been linked properly.");
	ctx.glGetProgramiv(program, GL_TESS_GEN_POINT_MODE, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteProgram(program);
}